

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPARRAY ppJVar5;
  uint local_54;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  JSAMPARRAY ppJStack_28;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  uVar1 = cinfo->output_width;
  outptr._4_4_ = num_rows;
  ppJStack_28 = output_buf;
  output_buf_local._4_4_ = input_row;
  while (outptr._4_4_ = outptr._4_4_ + -1, -1 < outptr._4_4_) {
    pJVar2 = (*input_buf)[output_buf_local._4_4_];
    pJVar3 = input_buf[1][output_buf_local._4_4_];
    pJVar4 = input_buf[2][output_buf_local._4_4_];
    output_buf_local._4_4_ = output_buf_local._4_4_ + 1;
    ppJVar5 = ppJStack_28 + 1;
    inptr0 = *ppJStack_28;
    for (local_54 = 0; ppJStack_28 = ppJVar5, local_54 < uVar1; local_54 = local_54 + 1) {
      *inptr0 = pJVar2[local_54];
      inptr0[1] = pJVar3[local_54];
      inptr0[2] = pJVar4[local_54];
      inptr0 = inptr0 + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_convert (j_decompress_ptr cinfo,
	     JSAMPIMAGE input_buf, JDIMENSION input_row,
	     JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED]   = inptr0[col];
      outptr[RGB_GREEN] = inptr1[col];
      outptr[RGB_BLUE]  = inptr2[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}